

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

bool __thiscall dg::vr::Bucket::EdgeIterator::nextViableTopEdge(EdgeIterator *this)

{
  bool bVar1;
  reference pvVar2;
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  *this_00;
  long in_RDI;
  DirectRelIterator *in_stack_ffffffffffffffa0;
  DirectRelIterator *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  
  while( true ) {
    std::
    vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>::
    back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
          *)in_stack_ffffffffffffffa0);
    bVar1 = DirectRelIterator::nextViableEdge(in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return false;
    }
    bVar1 = isViable((EdgeIterator *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0));
    if (bVar1) break;
    std::
    vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>::
    back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
          *)in_stack_ffffffffffffffa0);
    DirectRelIterator::inc(in_stack_ffffffffffffffa0);
  }
  std::
  reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
  ::get((reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
         *)(in_RDI + 0x28));
  pvVar2 = std::
           vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ::back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                   *)in_stack_ffffffffffffffa0);
  DirectRelIterator::operator*(pvVar2);
  std::
  set<dg::vr::Bucket::RelationEdge,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
  ::emplace<dg::vr::Bucket::RelationEdge_const&>
            ((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
             (RelationEdge *)in_stack_ffffffffffffffb8);
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    this_00 = std::
              reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
              ::get((reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
                     *)(in_RDI + 0x28));
    pvVar2 = std::
             vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
             ::back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                     *)this_00);
    DirectRelIterator::operator->(pvVar2);
    RelationEdge::inverted
              ((RelationEdge *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0));
    std::
    set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
    ::emplace<dg::vr::Bucket::RelationEdge>
              ((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               (RelationEdge *)in_stack_ffffffffffffffb8);
  }
  return true;
}

Assistant:

bool nextViableTopEdge() {
            while (stack.back().nextViableEdge()) {
                if (isViable()) {
                    visited.get().emplace(*stack.back());
                    if (undirectedOnly)
                        visited.get().emplace(stack.back()->inverted());
                    return true;
                }
                stack.back().inc();
            }
            return false;
        }